

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::setup_ib0(xr_ogf_v3 *this)

{
  size_t sVar1;
  ogf3_vsplit *poVar2;
  ulong uVar3;
  uint16_t *puVar4;
  uint_fast32_t end_idx;
  ogf3_vsplit *end;
  ogf3_vsplit *p;
  ulong uStack_18;
  uint16_t active_vb_size;
  size_t fix_idx;
  xr_ogf_v3 *this_local;
  
  xr_ibuf::operator=(&this->m_ib0,&(this->super_xr_ogf).m_ib);
  uStack_18 = 0;
  p._6_2_ = (ushort)this->m_min_vertices;
  end = this->m_vsplits;
  sVar1 = xr_flexbuf::size(&(this->super_xr_ogf).m_vb.super_xr_flexbuf);
  poVar2 = end + (sVar1 - this->m_min_vertices);
  for (; end != poVar2; end = end + 1) {
    uVar3 = uStack_18 + end->fix_faces;
    for (; uStack_18 < uVar3; uStack_18 = uStack_18 + 1) {
      puVar4 = xr_ibuf::operator[](&this->m_ib0,(ulong)this->m_fix_faces[uStack_18]);
      *puVar4 = p._6_2_;
    }
    p._6_2_ = p._6_2_ + 1;
  }
  sVar1 = xr_flexbuf::size(&(this->super_xr_ogf).m_vb.super_xr_flexbuf);
  if (p._6_2_ == sVar1) {
    return;
  }
  __assert_fail("active_vb_size == m_vb.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,99,"void xray_re::xr_ogf_v3::setup_ib0()");
}

Assistant:

void xr_ogf_v3::setup_ib0()
{
	m_ib0 = m_ib;
	size_t fix_idx = 0;
	uint16_t active_vb_size = uint16_t(m_min_vertices & UINT16_MAX);
	for (ogf3_vsplit *p = m_vsplits, *end = p + m_vb.size() - m_min_vertices; p != end; ++p) {
		for (uint_fast32_t end_idx = fix_idx + p->fix_faces; fix_idx < end_idx; ++fix_idx)
			m_ib0[m_fix_faces[fix_idx]] = active_vb_size;
		++active_vb_size;
	}
	assert(active_vb_size == m_vb.size());
}